

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O2

PolarSpeakerPosition * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock
          (PolarSpeakerPosition *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,
          PolarSpeakerPosition *pos)

{
  double azimuth;
  double elevation;
  pair<double,_double> pVar1;
  ScreenEdgeLock local_70;
  
  azimuth = pos->azimuth;
  elevation = pos->elevation;
  ScreenEdgeLock::ScreenEdgeLock(&local_70,&pos->screenEdgeLock);
  pVar1 = ScreenEdgeLockHandler::handleAzimuthElevation
                    (&this->_screenEdgeLockHandler,azimuth,elevation,&local_70);
  pos->azimuth = pVar1.first;
  pos->elevation = pVar1.second;
  ScreenEdgeLock::~ScreenEdgeLock(&local_70);
  PolarSpeakerPosition::PolarSpeakerPosition(__return_storage_ptr__,pos);
  return __return_storage_ptr__;
}

Assistant:

PolarSpeakerPosition GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock(
      PolarSpeakerPosition pos) {
    std::tie(pos.azimuth, pos.elevation) =
        _screenEdgeLockHandler.handleAzimuthElevation(
            pos.azimuth, pos.elevation, pos.screenEdgeLock);
    return pos;
  }